

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
          (View<unsigned_char,_false,_std::allocator<unsigned_long>_> *this)

{
  geometry_type *this_00;
  size_t sVar1;
  ulong uVar2;
  size_t tmp;
  size_t sVar3;
  long lVar4;
  size_t j_2;
  size_t j;
  ulong uVar5;
  
  if ((this->geometry_).dimension_ == 0) {
    marray_detail::Assert<bool>((this->geometry_).isSimple_);
    if (this->data_ != (pointer)0x0) {
      marray_detail::Assert<bool>((this->geometry_).size_ == 1);
      return;
    }
  }
  else {
    this_00 = &this->geometry_;
    marray_detail::Assert<bool>(this->data_ != (pointer)0x0);
    sVar3 = 1;
    for (uVar5 = 0; uVar5 < (this->geometry_).dimension_; uVar5 = uVar5 + 1) {
      sVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(this_00,uVar5);
      sVar3 = sVar3 * sVar1;
    }
    marray_detail::Assert<bool>((this->geometry_).size_ == sVar3);
    if ((this->geometry_).coordinateOrder_ == FirstMajorOrder) {
      sVar3 = 1;
      lVar4 = -1;
      for (uVar5 = 0; uVar2 = (this->geometry_).dimension_, uVar5 < uVar2; uVar5 = uVar5 + 1) {
        sVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                          (this_00,uVar2 + lVar4);
        marray_detail::Assert<bool>(sVar1 == sVar3);
        sVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape
                          (this_00,(this->geometry_).dimension_ + lVar4);
        sVar3 = sVar3 * sVar1;
        lVar4 = lVar4 + -1;
      }
    }
    else {
      sVar3 = 1;
      for (uVar5 = 0; uVar2 = (this->geometry_).dimension_, uVar5 < uVar2; uVar5 = uVar5 + 1) {
        sVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides(this_00,uVar5)
        ;
        marray_detail::Assert<bool>(sVar1 == sVar3);
        sVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(this_00,uVar5);
        sVar3 = sVar3 * sVar1;
      }
    }
    if ((this->geometry_).isSimple_ == true) {
      for (uVar5 = 0; uVar5 < uVar2; uVar5 = uVar5 + 1) {
        sVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides(this_00,uVar5);
        sVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides(this_00,uVar5)
        ;
        marray_detail::Assert<bool>(sVar3 == sVar1);
        uVar2 = (this->geometry_).dimension_;
      }
    }
  }
  return;
}

Assistant:

inline void
View<T, isConst, A>::testInvariant() const
{
    if(!MARRAY_NO_DEBUG) {
        if(geometry_.dimension() == 0) {
            marray_detail::Assert(geometry_.isSimple() == true);
            if(data_ != 0) { // scalar
                marray_detail::Assert(geometry_.size() == 1);
            }
        }
        else {
            marray_detail::Assert(data_ != 0);

            // test size_ to be consistent with shape_
            std::size_t testSize = 1;
            for(std::size_t j=0; j<geometry_.dimension(); ++j) {
                testSize *= geometry_.shape(j);
            }
            marray_detail::Assert(geometry_.size() == testSize);

            // test shapeStrides_ to be consistent with shape_
            if(geometry_.coordinateOrder() == FirstMajorOrder) {
                std::size_t tmp = 1;
                for(std::size_t j=0; j<geometry_.dimension(); ++j) {
                    marray_detail::Assert(geometry_.shapeStrides(geometry_.dimension()-j-1) == tmp);
                    tmp *= geometry_.shape(geometry_.dimension()-j-1);
                }
            }
            else {
                std::size_t tmp = 1;
                for(std::size_t j=0; j<geometry_.dimension(); ++j) {
                    marray_detail::Assert(geometry_.shapeStrides(j) == tmp);
                    tmp *= geometry_.shape(j);
                }
            }

            // test the simplicity condition 
            if(geometry_.isSimple()) {
                for(std::size_t j=0; j<geometry_.dimension(); ++j) {
                    marray_detail::Assert(geometry_.strides(j) == geometry_.shapeStrides(j));
                }
            }
        }
    }
}